

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowLevelIoExamples.cpp
# Opt level: O3

ssize_t __thiscall C_IStream::read(C_IStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  InputExc *this_00;
  undefined4 in_register_00000034;
  
  sVar2 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(long)(int)__buf,(FILE *)this->_file);
  if ((int)sVar2 != (int)__buf) {
    iVar1 = ferror((FILE *)this->_file);
    if (iVar1 == 0) {
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc(this_00,"Unexpected end of file.");
      __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
    Iex_3_4::throwErrnoExc();
  }
  iVar1 = feof((FILE *)this->_file);
  return CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),iVar1 != 0);
}

Assistant:

bool
C_IStream::read (char c[/*n*/], int n)
{
    if (n != static_cast<int> (fread (c, 1, n, _file)))
    {
        //
        // fread() failed, but the return value does not distinguish
        // between I/O errors and end of file, so we call ferror() to
        // determine what happened.
        //

        if (ferror (_file))
            IEX_NAMESPACE::throwErrnoExc ();
        else
            throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");
    }

    return feof (_file);
}